

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::DumpByteCodeOffset(Instr *this)

{
  bool bVar1;
  char16 *pcVar2;
  JITTimeFunctionBody *this_00;
  char16_t *local_78;
  wchar local_68 [4];
  char16 debugStringBuffer [42];
  Instr *this_local;
  
  unique0x100001e5 = this;
  bVar1 = Func::HasByteCodeOffset(this->m_func);
  if (bVar1) {
    Output::SkipToColumn(0x4e);
    Output::Print(L"#");
    if (this->m_number != 0xffffffff) {
      Output::Print(L"%04x",(ulong)this->m_number);
      bVar1 = IsCloned(this);
      if (bVar1) {
        local_78 = L"*";
      }
      else {
        local_78 = L" ";
      }
      Output::Print(local_78);
    }
  }
  bVar1 = Func::IsTopFunc(this->m_func);
  if (!bVar1) {
    Output::SkipToColumn(0x4e);
    pcVar2 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_68);
    Output::Print(L" Func #%s",pcVar2);
  }
  if (this->bailOutByteCodeLocation != 0xffffffff) {
    Output::SkipToColumn(0x55);
    Output::Print(L"@%4d",(ulong)this->bailOutByteCodeLocation);
  }
  if (this->m_opcode == InlineeStart) {
    this_00 = Func::GetJITFunctionBody(this->m_func);
    pcVar2 = JITTimeFunctionBody::GetDisplayName(this_00);
    Output::Print(L" %s",pcVar2);
  }
  return;
}

Assistant:

void
Instr::DumpByteCodeOffset()
{
    if (m_func->HasByteCodeOffset())
    {
        Output::SkipToColumn(78);
        Output::Print(_u("#"));
        if (this->m_number != Js::Constants::NoByteCodeOffset)
        {
            Output::Print(_u("%04x"), this->m_number);
            Output::Print(this->IsCloned()? _u("*") : _u(" "));
        }
    }
    if (!this->m_func->IsTopFunc())
    {
        Output::SkipToColumn(78);
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u(" Func #%s"), this->m_func->GetDebugNumberSet(debugStringBuffer));
    }
#ifdef BAILOUT_INJECTION
    if (this->bailOutByteCodeLocation != (uint)-1)
    {
        Output::SkipToColumn(85);
        Output::Print(_u("@%4d"), this->bailOutByteCodeLocation);
    }
#endif
    if (this->m_opcode == Js::OpCode::InlineeStart)
    {
        Output::Print(_u(" %s"), this->m_func->GetJITFunctionBody()->GetDisplayName());
    }
}